

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

bool cbtGjkEpaSolver2::Distance
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  _ _Var6;
  code *pcVar7;
  long *plVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined8 uVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  cbtVector3 cVar22;
  undefined1 auVar23 [12];
  tShape shape;
  GJK gjk;
  float local_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  cbtVector3 local_2a0;
  tShape local_290;
  GJK local_200;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var6 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var6 == Valid) {
    if ((local_200.m_simplex)->rank == 0) {
      auVar12 = SUB6416(ZEXT864(0),0);
      auVar21 = ZEXT816(0);
      auVar19 = ZEXT816(0);
      local_2f0 = 0.0;
    }
    else {
      auVar19 = ZEXT816(0);
      fVar11 = 0.0;
      auVar21 = ZEXT816(0);
      uVar9 = 0;
      local_2f0 = 0.0;
      do {
        plVar8 = (long *)((long)&(local_290.m_shapes[0]->super_cbtCollisionShape).
                                 _vptr_cbtCollisionShape + local_290._136_8_);
        pcVar7 = (code *)local_290.Ls;
        if ((local_290.Ls & 1) != 0) {
          pcVar7 = *(code **)(local_290.Ls + *plVar8 + -1);
        }
        fVar1 = (local_200.m_simplex)->p[uVar9];
        auVar23 = (*pcVar7)(plVar8,(local_200.m_simplex)->c[uVar9]);
        local_2f0 = local_2f0 + auVar23._8_4_ * fVar1;
        auVar12._0_8_ = *(ulong *)((local_200.m_simplex)->c[uVar9]->d).m_floats ^ 0x8000000080000000
        ;
        auVar12._8_4_ = 0x80000000;
        auVar12._12_4_ = 0x80000000;
        auVar16._0_4_ = -((local_200.m_simplex)->c[uVar9]->d).m_floats[2];
        auVar16._4_4_ = 0x80000000;
        auVar16._8_4_ = 0x80000000;
        auVar16._12_4_ = 0x80000000;
        local_2a0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar12,auVar16,0x28);
        uVar15 = local_2a0.m_floats._8_8_;
        cVar22 = gjkepa2_impl::MinkowskiDiff::Support(&local_290,&local_2a0,1);
        local_2b8 = auVar19._0_4_;
        fStack_2b4 = auVar19._4_4_;
        fStack_2b0 = auVar19._8_4_;
        fStack_2ac = auVar19._12_4_;
        local_2c8 = auVar21._0_4_;
        fStack_2c4 = auVar21._4_4_;
        fStack_2c0 = auVar21._8_4_;
        fStack_2bc = auVar21._12_4_;
        uVar9 = uVar9 + 1;
        local_2d8 = auVar23._0_4_;
        fStack_2d4 = auVar23._4_4_;
        fStack_2d0 = (float)extraout_XMM0_Qb;
        fStack_2cc = (float)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar21._0_4_ = local_2c8 + fVar1 * cVar22.m_floats[0];
        auVar21._4_4_ = fStack_2c4 + fVar1 * cVar22.m_floats[1];
        auVar21._8_4_ = fStack_2c0 + fVar1 * (float)uVar15;
        auVar21._12_4_ = fStack_2bc + fVar1 * (float)((ulong)uVar15 >> 0x20);
        fVar11 = fVar11 + fVar1 * cVar22.m_floats[2];
        auVar12 = ZEXT416((uint)fVar11);
        auVar19._0_4_ = local_2b8 + fVar1 * local_2d8;
        auVar19._4_4_ = fStack_2b4 + fVar1 * fStack_2d4;
        auVar19._8_4_ = fStack_2b0 + fVar1 * fStack_2d0;
        auVar19._12_4_ = fStack_2ac + fVar1 * fStack_2cc;
      } while (uVar9 < (local_200.m_simplex)->rank);
    }
    auVar16 = vmovshdup_avx(auVar19);
    fVar11 = auVar16._0_4_;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[0].m_floats[1])),auVar19,
                             ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[1].m_floats[1])),auVar19
                              ,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[2].m_floats[1])),auVar19
                              ,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
    auVar16 = vsubps_avx(auVar19,auVar21);
    auVar19 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_2f0),
                              ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_2f0),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
    auVar13 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_2f0),
                              ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
    local_2f0 = local_2f0 - auVar12._0_4_;
    auVar19 = vinsertps_avx(ZEXT416((uint)(auVar19._0_4_ + (wtrs0->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar5._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(auVar13._0_4_ + (wtrs0->m_origin).m_floats[2])),
                            0x28);
    *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar19;
    auVar19 = vmovshdup_avx(auVar21);
    fVar11 = auVar19._0_4_;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[0].m_floats[1])),auVar21
                              ,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[1].m_floats[1])),auVar21,
                             ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (wtrs0->m_basis).m_el[2].m_floats[1])),auVar21
                              ,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
    auVar13 = vfmadd231ss_fma(auVar19,auVar12,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar12,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
    auVar12 = vfmadd231ss_fma(auVar21,auVar12,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
    fVar11 = auVar16._0_4_;
    auVar20._0_4_ = fVar11 * fVar11;
    fVar1 = auVar16._4_4_;
    auVar20._4_4_ = fVar1 * fVar1;
    fVar2 = auVar16._8_4_;
    auVar20._8_4_ = fVar2 * fVar2;
    fVar3 = auVar16._12_4_;
    auVar20._12_4_ = fVar3 * fVar3;
    auVar19 = vmovshdup_avx(auVar20);
    auVar19 = vfmadd231ss_fma(auVar19,auVar16,auVar16);
    auVar21 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_2f0),ZEXT416((uint)local_2f0));
    auVar19 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ + (wtrs0->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar5._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar23 = SUB1612(auVar5 << 0x40,4);
    auVar13._4_12_ = auVar23;
    auVar13._0_4_ = auVar12._0_4_ + (wtrs0->m_origin).m_floats[2];
    auVar18._20_12_ = auVar23;
    auVar18._16_4_ = local_2f0;
    auVar12 = vsqrtss_avx(auVar21,auVar21);
    auVar18._0_16_ = auVar13;
    uVar15 = vcmpss_avx512f(auVar12,ZEXT416(0x38d1b717),0xe);
    bVar4 = (bool)((byte)uVar15 & 1);
    fVar10 = (float)((uint)bVar4 * (int)(1.0 / auVar12._0_4_) + (uint)!bVar4 * 0x3f800000);
    auVar14._16_16_ = auVar13;
    auVar14._0_16_ = auVar13;
    auVar14 = vperm2f128_avx(auVar14,auVar18,0x31);
    auVar17._20_4_ = fVar1 * fVar10;
    auVar17._16_4_ = fVar11 * fVar10;
    auVar17._24_4_ = fVar2 * fVar10;
    auVar17._28_4_ = fVar3 * fVar10;
    auVar17._0_16_ = auVar19;
    auVar14 = vunpcklpd_avx(auVar17,auVar14);
    *(undefined1 (*) [32])(results->witnesses + 1) = auVar14;
    results->distance = auVar12._0_4_;
    (results->normal).m_floats[2] = local_2f0 * fVar10;
  }
  else {
    results->status = (_Var6 != Inside) + Penetrating;
  }
  return _Var6 == Valid;
}

Assistant:

bool cbtGjkEpaSolver2::Distance(const cbtConvexShape* shape0,
							   const cbtTransform& wtrs0,
							   const cbtConvexShape* shape1,
							   const cbtTransform& wtrs1,
							   const cbtVector3& guess,
							   sResults& results)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, false);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, guess);
	if (gjk_status == GJK::eStatus::Valid)
	{
		cbtVector3 w0 = cbtVector3(0, 0, 0);
		cbtVector3 w1 = cbtVector3(0, 0, 0);
		for (U i = 0; i < gjk.m_simplex->rank; ++i)
		{
			const cbtScalar p = gjk.m_simplex->p[i];
			w0 += shape.Support(gjk.m_simplex->c[i]->d, 0) * p;
			w1 += shape.Support(-gjk.m_simplex->c[i]->d, 1) * p;
		}
		results.witnesses[0] = wtrs0 * w0;
		results.witnesses[1] = wtrs0 * w1;
		results.normal = w0 - w1;
		results.distance = results.normal.length();
		results.normal /= results.distance > GJK_MIN_DISTANCE ? results.distance : 1;
		return (true);
	}
	else
	{
		results.status = gjk_status == GJK::eStatus::Inside ? sResults::Penetrating : sResults::GJK_Failed;
		return (false);
	}
}